

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O3

BinaryenExpressionRef BinaryenTryGetCatchBodyAt(BinaryenExpressionRef expr,BinaryenIndex index)

{
  if (expr->_id != TryId) {
    __assert_fail("expression->is<Try>()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0xeb5,
                  "BinaryenExpressionRef BinaryenTryGetCatchBodyAt(BinaryenExpressionRef, BinaryenIndex)"
                 );
  }
  if ((ulong)index < *(ulong *)(expr + 5)) {
    return *(BinaryenExpressionRef *)(expr[4].type.id + (ulong)index * 8);
  }
  __assert_fail("index < static_cast<Try*>(expression)->catchBodies.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0xeb6,
                "BinaryenExpressionRef BinaryenTryGetCatchBodyAt(BinaryenExpressionRef, BinaryenIndex)"
               );
}

Assistant:

BinaryenExpressionRef BinaryenTryGetCatchBodyAt(BinaryenExpressionRef expr,
                                                BinaryenIndex index) {
  auto* expression = (Expression*)expr;
  assert(expression->is<Try>());
  assert(index < static_cast<Try*>(expression)->catchBodies.size());
  return static_cast<Try*>(expression)->catchBodies[index];
}